

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization.cpp
# Opt level: O1

void __thiscall CLocConstString::Reload(CLocConstString *this)

{
  char *pcVar1;
  
  this->m_Version = g_Localization.m_CurrentVersion;
  pcVar1 = CLocalizationDatabase::FindString(&g_Localization,this->m_Hash,this->m_ContextHash);
  this->m_pCurrentStr = pcVar1;
  if (pcVar1 == (char *)0x0) {
    this->m_pCurrentStr = this->m_pDefaultStr;
  }
  return;
}

Assistant:

void CLocConstString::Reload()
{
	m_Version = g_Localization.Version();
	const char *pNewStr = g_Localization.FindString(m_Hash, m_ContextHash);
	m_pCurrentStr = pNewStr;
	if(!m_pCurrentStr)
		m_pCurrentStr = m_pDefaultStr;
}